

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O0

int __thiscall MediaManager::GetTypeFromFile(MediaManager *this,string *str)

{
  bool bVar1;
  char *pcVar2;
  FILE *__stream;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1e8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1c8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_188;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_158;
  undefined1 local_138 [8];
  uchar buffer [256];
  FILE *file;
  int return_type;
  string *str_local;
  MediaManager *this_local;
  
  file._4_4_ = 0;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar2,"rb");
  if (__stream != (FILE *)0x0) {
    memset(local_138,0,0x100);
    fread(local_138,1,0x100,__stream);
    fclose(__stream);
    file._4_4_ = (*(this->super_ITypeManager)._vptr_ITypeManager[1])(this,local_138,0x100);
  }
  if (file._4_4_ == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_158,"*\\.rom",0x10);
    bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pcVar2,&local_158,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_158);
    if (bVar1) {
      file._4_4_ = 2;
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_188,"*\\.raw",0x10);
      bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pcVar2,&local_188,0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_188);
      if (bVar1) {
        file._4_4_ = 3;
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_1a8,"*\\.tap",0x10);
        bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pcVar2,&local_1a8,0);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1a8)
        ;
        if (bVar1) {
          file._4_4_ = 4;
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    (&local_1c8,"*\\.bin",0x10);
          bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pcVar2,&local_1c8,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_1c8);
          if (bVar1) {
            return 6;
          }
          pcVar2 = (char *)std::__cxx11::string::c_str();
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                    (&local_1e8,"*\\.cpr",0x10);
          bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>(pcVar2,&local_1e8,0);
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_1e8);
          if (bVar1) {
            return 8;
          }
        }
      }
    }
  }
  return file._4_4_;
}

Assistant:

int MediaManager::GetTypeFromFile(std::string str)
{
   int return_type = MEDIA_UNDEF;
   // Check buffer
   FILE* file;

   if (fopen_s(&file, str.c_str(), "rb") == 0)
   {
      unsigned char buffer [0x100] = {0};
      // check the 22 first char
      fread(buffer, 1, 0x100, file);
      fclose(file);

      return_type = GetTypeFromBuffer(buffer, 0x100);
   }

   if (return_type == MEDIA_UNDEF)
   {
      // Check file extension

      //if (PathMatchSpec(str.c_str(), _T("*.rom")) == TRUE)
      if (regex_match(str.c_str(), std::regex("*\\.rom")))
      {
         return_type = MEDIA_ROM;
      }
      else //if (PathMatchSpec(str.c_str(), _T("*.raw")) == TRUE)
         if (regex_match(str.c_str(), std::regex("*\\.raw")))
         {
            return_type = MEDIA_DISK;
         }
         else //if (PathMatchSpec(str.c_str(), _T("*.tap")) == TRUE)
            if (regex_match(str.c_str(), std::regex("*\\.tap")))
            {
               return_type = MEDIA_TAPE;
            }
            else //if (PathMatchSpec(str.c_str(), _T("*.bin")) == TRUE)
               if (regex_match(str.c_str(), std::regex("*\\.bin")))
               {
                  return MEDIA_BIN;
               }
               else //if (PathMatchSpec(str.c_str(), _T("*.cpr")) == TRUE)
                  if (regex_match(str.c_str(), std::regex("*\\.cpr")))
                  {
                     return MEDIA_CPR;
                  }
   }

   return return_type;
}